

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O3

int __thiscall despot::Chain::NumActions(Chain *this)

{
  return 2;
}

Assistant:

double Chain::Reward(int s1, ACT_TYPE action, int s2) const {
	/*
	 if (action == ACTION_B)
	 return 2;
	 return s1 == 4 ? 10 : 0;
	 */
	if (s2 == 0) {
		return 2;
	} else
		return (s1 == s2 && s2 == NUM_MDP_STATES - 1) ? 10 : 0;
	//return s2 == NUM_MDP_STATES-1 ? 10 : 0;
}